

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O3

void ncnn::convdw3x3s2_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  void **ppvVar1;
  undefined1 (*pauVar2) [12];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined1 (*pauVar6) [28];
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  undefined1 (*pauVar14) [12];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  uint uVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar141 [12];
  undefined1 auVar142 [12];
  undefined1 auVar143 [12];
  undefined1 auVar144 [12];
  undefined1 auVar145 [12];
  undefined1 auVar146 [28];
  int iVar147;
  long lVar148;
  float *pfVar149;
  int iVar150;
  uint uVar151;
  float *pfVar152;
  int iVar153;
  uint uVar154;
  long lVar155;
  long lVar156;
  float *pfVar157;
  float *pfVar158;
  void *pvVar159;
  int *piVar160;
  size_t sVar161;
  undefined8 uVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float in_register_0000125c;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float in_register_0000129c;
  float fVar170;
  float in_register_000012dc;
  float fVar171;
  float fVar172;
  float in_register_0000151c;
  float fVar173;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  
  iVar20 = bottom_blob->c;
  if (0 < (long)iVar20) {
    uVar21 = top_blob->w;
    iVar22 = top_blob->h;
    iVar147 = (bottom_blob->w - uVar21) * 0x10;
    lVar156 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        piVar160 = (int *)0x0;
        pvVar159 = (void *)0x0;
        sVar161 = 0;
        uVar162 = 0;
      }
      else {
        ppvVar1 = &_bias->data + lVar156 * 4;
        pvVar159 = *ppvVar1;
        piVar160 = (int *)ppvVar1[1];
        sVar161 = (size_t)ppvVar1[2];
        uVar162 = ppvVar1[3];
      }
      local_1b8 = SUB84(pvVar159,0);
      fStack_1b4 = (float)((ulong)pvVar159 >> 0x20);
      fStack_1b0 = SUB84(piVar160,0);
      fStack_1ac = (float)((ulong)piVar160 >> 0x20);
      fStack_1a8 = (float)sVar161;
      fStack_1a4 = (float)(sVar161 >> 0x20);
      fStack_1a0 = (float)uVar162;
      fStack_19c = (float)((ulong)uVar162 >> 0x20);
      if (0 < iVar22) {
        pfVar157 = (float *)(top_blob->cstep * lVar156 * top_blob->elemsize + (long)top_blob->data);
        lVar148 = kernel->w * lVar156 * kernel->elemsize;
        pvVar159 = kernel->data;
        pauVar2 = (undefined1 (*) [12])((long)pvVar159 + lVar148);
        auVar143 = *pauVar2;
        local_d8 = (float)*(undefined8 *)*pauVar2;
        fStack_d4 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_d0 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_cc = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        fStack_c8 = (float)*(undefined8 *)(pauVar2[1] + 4);
        fStack_c4 = (float)((ulong)*(undefined8 *)(pauVar2[1] + 4) >> 0x20);
        fStack_c0 = (float)*(undefined8 *)pauVar2[2];
        fStack_bc = (float)((ulong)*(undefined8 *)pauVar2[2] >> 0x20);
        pauVar6 = (undefined1 (*) [28])((long)pvVar159 + lVar148 + 0x20);
        fVar112 = *(float *)*pauVar6;
        fVar113 = *(float *)(*pauVar6 + 4);
        fVar114 = *(float *)(*pauVar6 + 8);
        fVar115 = *(float *)(*pauVar6 + 0xc);
        fVar116 = *(float *)(*pauVar6 + 0x10);
        fVar117 = *(float *)(*pauVar6 + 0x14);
        fVar118 = *(float *)(*pauVar6 + 0x18);
        auVar146 = *pauVar6;
        fVar119 = *(float *)pauVar6[1];
        pauVar2 = (undefined1 (*) [12])((long)pvVar159 + lVar148 + 0x40);
        auVar144 = *pauVar2;
        auVar141 = *pauVar2;
        pfVar149 = (float *)((long)pvVar159 + lVar148 + 0x60);
        fVar133 = *pfVar149;
        fVar134 = pfVar149[1];
        fVar135 = pfVar149[2];
        fVar136 = pfVar149[3];
        fVar137 = pfVar149[4];
        fVar138 = pfVar149[5];
        fVar139 = pfVar149[6];
        fVar140 = pfVar149[7];
        pauVar14 = (undefined1 (*) [12])((long)pvVar159 + lVar148 + 0x80);
        auVar145 = *pauVar14;
        auVar142 = *pauVar14;
        auVar15 = *(undefined1 (*) [32])((long)pvVar159 + lVar148 + 0xa0);
        pfVar149 = (float *)((long)pvVar159 + lVar148 + 0xc0);
        fVar125 = *pfVar149;
        fVar126 = pfVar149[1];
        fVar127 = pfVar149[2];
        fVar128 = pfVar149[3];
        fVar129 = pfVar149[4];
        fVar130 = pfVar149[5];
        fVar131 = pfVar149[6];
        fVar132 = pfVar149[7];
        auVar16 = *(undefined1 (*) [32])((long)pvVar159 + lVar148 + 0xe0);
        auVar17 = *(undefined1 (*) [32])((long)pvVar159 + lVar148 + 0x100);
        pfVar158 = (float *)(bottom_blob->cstep * lVar156 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
        lVar148 = (long)bottom_blob->w * bottom_blob->elemsize;
        pfVar152 = (float *)(lVar148 * 2 + (long)pfVar158);
        pfVar149 = (float *)(lVar148 + (long)pfVar158);
        iVar153 = 0;
        local_118 = (float)*(undefined8 *)*pauVar2;
        fStack_114 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_110 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_10c = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        fStack_108 = (float)*(undefined8 *)(pauVar2[1] + 4);
        fStack_104 = (float)((ulong)*(undefined8 *)(pauVar2[1] + 4) >> 0x20);
        fStack_100 = (float)*(undefined8 *)pauVar2[2];
        local_138 = (float)*(undefined8 *)*pauVar14;
        fStack_134 = (float)((ulong)*(undefined8 *)*pauVar14 >> 0x20);
        fStack_130 = (float)*(undefined8 *)(*pauVar14 + 8);
        fStack_12c = (float)((ulong)*(undefined8 *)(*pauVar14 + 8) >> 0x20);
        fStack_128 = (float)*(undefined8 *)(pauVar14[1] + 4);
        fStack_124 = (float)((ulong)*(undefined8 *)(pauVar14[1] + 4) >> 0x20);
        fStack_120 = (float)*(undefined8 *)pauVar14[2];
        fStack_11c = (float)((ulong)*(undefined8 *)pauVar14[2] >> 0x20);
        fVar165 = fVar119;
        do {
          local_78 = auVar17._0_4_;
          fStack_74 = auVar17._4_4_;
          fStack_70 = auVar17._8_4_;
          fStack_6c = auVar17._12_4_;
          fStack_68 = auVar17._16_4_;
          fStack_64 = auVar17._20_4_;
          fStack_60 = auVar17._24_4_;
          local_158 = auVar15._0_4_;
          fStack_154 = auVar15._4_4_;
          fStack_150 = auVar15._8_4_;
          fStack_14c = auVar15._12_4_;
          fStack_148 = auVar15._16_4_;
          fStack_144 = auVar15._20_4_;
          fStack_140 = auVar15._24_4_;
          local_f8 = auVar16._0_4_;
          fStack_f4 = auVar16._4_4_;
          fStack_f0 = auVar16._8_4_;
          fStack_ec = auVar16._12_4_;
          fStack_e8 = auVar16._16_4_;
          fStack_e4 = auVar16._20_4_;
          fStack_e0 = auVar16._24_4_;
          if ((int)uVar21 < 4) {
            uVar151 = 0;
          }
          else {
            iVar150 = 3;
            do {
              fVar165 = pfVar158[1];
              fVar23 = pfVar158[2];
              fVar24 = pfVar158[3];
              fVar25 = pfVar158[4];
              fVar26 = pfVar158[5];
              fVar27 = pfVar158[6];
              fVar28 = pfVar158[9];
              fVar29 = pfVar158[10];
              fVar30 = pfVar158[0xb];
              fVar31 = pfVar158[0xc];
              fVar32 = pfVar158[0xd];
              fVar33 = pfVar158[0xe];
              fVar34 = pfVar158[0x10];
              fVar35 = pfVar158[0x11];
              fVar36 = pfVar158[0x12];
              fVar37 = pfVar158[0x13];
              fVar38 = pfVar158[0x14];
              fVar39 = pfVar158[0x15];
              fVar40 = pfVar158[0x16];
              fVar41 = pfVar158[0x17];
              fVar42 = pfVar149[1];
              fVar43 = pfVar149[2];
              fVar44 = pfVar149[3];
              fVar45 = pfVar149[4];
              fVar46 = pfVar149[5];
              fVar47 = pfVar149[6];
              fVar48 = pfVar149[9];
              fVar49 = pfVar149[10];
              fVar50 = pfVar149[0xb];
              fVar51 = pfVar149[0xc];
              fVar52 = pfVar149[0xd];
              fVar53 = pfVar149[0xe];
              fVar54 = pfVar149[0x10];
              fVar55 = pfVar149[0x11];
              fVar56 = pfVar149[0x12];
              fVar57 = pfVar149[0x13];
              fVar58 = pfVar149[0x14];
              fVar168 = pfVar149[0x15];
              fVar59 = pfVar149[0x16];
              fVar60 = pfVar152[1];
              fVar61 = pfVar152[2];
              fVar62 = pfVar152[3];
              fVar63 = pfVar152[4];
              fVar64 = pfVar152[5];
              fVar65 = pfVar152[6];
              fStack_13c = auVar15._28_4_;
              fStack_dc = auVar16._28_4_;
              fVar66 = pfVar152[9];
              fVar67 = pfVar152[10];
              fVar68 = pfVar152[0xb];
              fVar69 = pfVar152[0xc];
              fVar70 = pfVar152[0xd];
              fVar71 = pfVar152[0xe];
              fVar173 = in_register_0000151c + fStack_19c + fVar132 + in_register_0000151c;
              fVar72 = pfVar158[0x18];
              fVar73 = pfVar158[0x19];
              fVar74 = pfVar158[0x1a];
              fVar75 = pfVar158[0x1b];
              fVar76 = pfVar158[0x1c];
              fVar77 = pfVar158[0x1d];
              fVar78 = pfVar158[0x1e];
              fVar79 = pfVar152[0x10];
              fVar80 = pfVar152[0x11];
              fVar81 = pfVar152[0x12];
              fVar82 = pfVar152[0x13];
              fVar83 = pfVar152[0x14];
              fVar84 = pfVar152[0x15];
              fVar85 = pfVar152[0x16];
              fVar86 = pfVar149[0x18];
              fVar87 = pfVar149[0x19];
              fVar88 = pfVar149[0x1a];
              fVar89 = pfVar149[0x1b];
              fVar90 = pfVar149[0x1c];
              fVar167 = pfVar149[0x1d];
              fVar170 = pfVar149[0x1e];
              fVar172 = pfVar152[0x18];
              fVar91 = pfVar152[0x19];
              fVar92 = pfVar152[0x1a];
              fVar93 = pfVar152[0x1b];
              fVar94 = pfVar152[0x1c];
              fVar95 = pfVar152[0x1d];
              fVar96 = pfVar152[0x1e];
              fVar97 = pfVar149[0x20];
              fVar98 = pfVar149[0x21];
              fVar99 = pfVar149[0x22];
              fVar100 = pfVar149[0x23];
              fVar101 = pfVar149[0x24];
              fVar102 = pfVar149[0x25];
              fVar103 = pfVar149[0x26];
              fVar169 = pfVar149[0x27];
              local_58 = (float)*(undefined8 *)(pfVar158 + 0x20);
              fStack_54 = (float)((ulong)*(undefined8 *)(pfVar158 + 0x20) >> 0x20);
              fStack_50 = (float)*(undefined8 *)(pfVar158 + 0x22);
              fStack_4c = (float)((ulong)*(undefined8 *)(pfVar158 + 0x22) >> 0x20);
              fStack_48 = (float)*(undefined8 *)(pfVar158 + 0x24);
              fStack_44 = (float)((ulong)*(undefined8 *)(pfVar158 + 0x24) >> 0x20);
              fStack_40 = (float)*(undefined8 *)(pfVar158 + 0x26);
              fVar171 = fStack_11c + fStack_dc;
              fVar104 = pfVar152[0x20];
              fVar105 = pfVar152[0x21];
              fVar106 = pfVar152[0x22];
              fVar107 = pfVar152[0x23];
              fVar108 = pfVar152[0x24];
              fVar109 = pfVar152[0x25];
              fVar110 = pfVar152[0x26];
              fVar111 = pfVar152[0x27];
              fVar163 = fVar173 + fVar140 + fVar140 + fVar140 + fVar132 + fStack_13c + fStack_11c;
              fVar166 = fVar41 + fStack_19c + pfVar149[0x17] + fVar173 +
                        fVar140 + fVar119 + fStack_dc;
              *pfVar157 = local_d8 * *pfVar158 + local_1b8 +
                          fVar112 * pfVar158[8] + fVar34 * local_118 +
                          fVar54 * local_158 + fVar133 * *pfVar149 + local_138 * pfVar149[8] +
                          fVar125 * *pfVar152 + local_f8 * pfVar152[8] + fVar79 * local_78;
              pfVar157[1] = fStack_d4 * fVar165 + fStack_1b4 +
                            fVar113 * fVar28 + fVar35 * fStack_114 +
                            fVar55 * fStack_154 + fVar134 * fVar42 + fStack_134 * fVar48 +
                            fVar126 * fVar60 + fStack_f4 * fVar66 + fVar80 * fStack_74;
              pfVar157[2] = fStack_d0 * fVar23 + fStack_1b0 + fVar114 * fVar29 + fVar36 * fStack_110
                            + fVar56 * fStack_150 + fVar135 * fVar43 + fStack_130 * fVar49 +
                            fVar127 * fVar61 + fStack_f0 * fVar67 + fVar81 * fStack_70;
              pfVar157[3] = fStack_cc * fVar24 + fStack_1ac + fVar115 * fVar30 + fVar37 * fStack_10c
                            + fVar57 * fStack_14c + fVar136 * fVar44 + fStack_12c * fVar50 +
                            fVar128 * fVar62 + fStack_ec * fVar68 + fVar82 * fStack_6c;
              pfVar157[4] = fStack_c8 * fVar25 + fStack_1a8 + fVar116 * fVar31 + fVar38 * fStack_108
                            + fVar58 * fStack_148 + fVar137 * fVar45 + fStack_128 * fVar51 +
                            fVar129 * fVar63 + fStack_e8 * fVar69 + fVar83 * fStack_68;
              pfVar157[5] = fStack_c4 * fVar26 + fStack_1a4 + fVar117 * fVar32 + fVar39 * fStack_104
                            + fVar168 * fStack_144 + fVar138 * fVar46 + fStack_124 * fVar52 +
                            fVar130 * fVar64 + fStack_e4 * fVar70 + fVar84 * fStack_64;
              pfVar157[6] = fStack_c0 * fVar27 + fStack_1a0 + fVar118 * fVar33 + fVar40 * fStack_100
                            + fVar59 * fStack_140 + fVar139 * fVar47 + fStack_120 * fVar53 +
                            fVar131 * fVar65 + fStack_e0 * fVar71 + fVar85 * fStack_60;
              pfVar157[7] = fVar163;
              fVar164 = fVar166 + fVar171 + fVar163;
              auVar18 = *(undefined1 (*) [32])(pfVar158 + 0x30);
              fVar163 = pfVar149[0x30];
              fVar173 = pfVar149[0x31];
              fVar120 = pfVar149[0x32];
              fVar121 = pfVar149[0x33];
              fVar122 = pfVar149[0x34];
              fVar123 = pfVar149[0x35];
              fVar124 = pfVar149[0x36];
              in_register_0000151c = pfVar149[0x37];
              fVar23 = pfVar152[0x30];
              fVar24 = pfVar152[0x31];
              fVar25 = pfVar152[0x32];
              fVar26 = pfVar152[0x33];
              fVar27 = pfVar152[0x34];
              fVar28 = pfVar152[0x35];
              fVar29 = pfVar152[0x36];
              fVar165 = pfVar158[0x28];
              fVar30 = pfVar158[0x29];
              fVar31 = pfVar158[0x2a];
              fVar32 = pfVar158[0x2b];
              fVar33 = pfVar158[0x2c];
              fVar42 = pfVar158[0x2d];
              fVar43 = pfVar158[0x2e];
              fVar44 = pfVar149[0x28];
              fVar45 = pfVar149[0x29];
              fVar46 = pfVar149[0x2a];
              fVar47 = pfVar149[0x2b];
              fVar48 = pfVar149[0x2c];
              fVar49 = pfVar149[0x2d];
              fVar50 = pfVar149[0x2e];
              fVar51 = pfVar152[0x28];
              fVar52 = pfVar152[0x29];
              fVar53 = pfVar152[0x2a];
              fVar60 = pfVar152[0x2b];
              fVar61 = pfVar152[0x2c];
              fVar62 = pfVar152[0x2d];
              fVar63 = pfVar152[0x2e];
              pfVar157[8] = fVar34 * local_d8 + local_1b8 + fVar54 * fVar133 + fVar79 * fVar125 +
                            local_138 * fVar86 + fVar112 * fVar72 + local_f8 * fVar172 +
                            local_58 * local_118 + fVar97 * local_158 + local_78 * fVar104;
              pfVar157[9] = fVar35 * fStack_d4 + fStack_1b4 + fVar55 * fVar134 + fVar80 * fVar126 +
                            fStack_134 * fVar87 + fVar113 * fVar73 + fStack_f4 * fVar91 +
                            fStack_54 * fStack_114 + fVar98 * fStack_154 + fStack_74 * fVar105;
              pfVar157[10] = fVar36 * fStack_d0 + fStack_1b0 + fVar56 * fVar135 + fVar81 * fVar127 +
                             fStack_130 * fVar88 + fVar114 * fVar74 + fStack_f0 * fVar92 +
                             fStack_50 * fStack_110 + fVar99 * fStack_150 + fStack_70 * fVar106;
              pfVar157[0xb] =
                   fVar37 * fStack_cc + fStack_1ac + fVar57 * fVar136 + fVar82 * fVar128 +
                   fStack_12c * fVar89 + fVar115 * fVar75 + fStack_ec * fVar93 +
                   fStack_4c * fStack_10c + fVar100 * fStack_14c + fStack_6c * fVar107;
              pfVar157[0xc] =
                   fVar38 * fStack_c8 + fStack_1a8 + fVar58 * fVar137 + fVar83 * fVar129 +
                   fStack_128 * fVar90 + fVar116 * fVar76 + fStack_e8 * fVar94 +
                   fStack_48 * fStack_108 + fVar101 * fStack_148 + fStack_68 * fVar108;
              pfVar157[0xd] =
                   fVar39 * fStack_c4 + fStack_1a4 + fVar168 * fVar138 + fVar84 * fVar130 +
                   fStack_124 * fVar167 + fVar117 * fVar77 + fStack_e4 * fVar95 +
                   fStack_44 * fStack_104 + fVar102 * fStack_144 + fStack_64 * fVar109;
              pfVar157[0xe] =
                   fVar40 * fStack_c0 + fStack_1a0 + fVar59 * fVar139 + fVar85 * fVar131 +
                   fStack_120 * fVar170 + fVar118 * fVar78 + fStack_e0 * fVar96 +
                   fStack_40 * fStack_100 + fVar103 * fStack_140 + fStack_60 * fVar110;
              pfVar157[0xf] = fVar164;
              fVar34 = pfVar158[0x38];
              fVar35 = pfVar158[0x39];
              fVar36 = pfVar158[0x3a];
              fVar37 = pfVar158[0x3b];
              fVar38 = pfVar158[0x3c];
              fVar39 = pfVar158[0x3d];
              fVar40 = pfVar158[0x3e];
              fVar54 = pfVar158[0x40];
              fVar55 = pfVar158[0x41];
              fVar56 = pfVar158[0x42];
              fVar57 = pfVar158[0x43];
              fVar58 = pfVar158[0x44];
              fVar168 = pfVar158[0x45];
              fVar59 = pfVar158[0x46];
              fVar167 = fVar171 + fVar166 + fVar41 + fStack_19c;
              fVar41 = pfVar149[0x38];
              fVar64 = pfVar149[0x39];
              fVar65 = pfVar149[0x3a];
              fVar66 = pfVar149[0x3b];
              fVar67 = pfVar149[0x3c];
              fVar68 = pfVar149[0x3d];
              fVar69 = pfVar149[0x3e];
              fVar70 = pfVar149[0x40];
              fVar71 = pfVar149[0x41];
              fVar72 = pfVar149[0x42];
              fVar73 = pfVar149[0x43];
              fVar74 = pfVar149[0x44];
              fVar75 = pfVar149[0x45];
              fVar76 = pfVar149[0x46];
              fVar172 = fVar169 + fStack_bc + fVar111;
              fVar170 = fStack_bc + fVar169 + fStack_19c;
              fVar77 = pfVar152[0x38];
              fVar78 = pfVar152[0x39];
              fVar79 = pfVar152[0x3a];
              fVar80 = pfVar152[0x3b];
              fVar81 = pfVar152[0x3c];
              fVar82 = pfVar152[0x3d];
              fVar83 = pfVar152[0x3e];
              in_register_000012dc = fStack_bc + fStack_bc + fVar171;
              fVar84 = pfVar152[0x40];
              fVar85 = pfVar152[0x41];
              fVar86 = pfVar152[0x42];
              fVar87 = pfVar152[0x43];
              fVar88 = pfVar152[0x44];
              fVar89 = pfVar152[0x45];
              fVar90 = pfVar152[0x46];
              in_register_0000125c = fVar172 + fVar167;
              in_register_0000129c = fVar172 + fStack_19c + fVar170 + fVar172 + in_register_000012dc
              ;
              pfVar157[0x10] =
                   local_d8 * local_58 + local_1b8 + fVar97 * fVar133 + fVar104 * fVar125 +
                   auVar146._0_4_ * fVar165 + local_138 * fVar44 + local_f8 * fVar51 +
                   fVar23 * local_78 + fVar163 * local_158 + auVar18._0_4_ * local_118;
              pfVar157[0x11] =
                   fStack_d4 * fStack_54 + fStack_1b4 + fVar98 * fVar134 + fVar105 * fVar126 +
                   auVar146._4_4_ * fVar30 + fStack_134 * fVar45 + fStack_f4 * fVar52 +
                   fVar24 * fStack_74 + fVar173 * fStack_154 + auVar18._4_4_ * fStack_114;
              pfVar157[0x12] =
                   fStack_d0 * fStack_50 + fStack_1b0 + fVar99 * fVar135 + fVar106 * fVar127 +
                   auVar146._8_4_ * fVar31 + fStack_130 * fVar46 + fStack_f0 * fVar53 +
                   fVar25 * fStack_70 + fVar120 * fStack_150 + auVar18._8_4_ * fStack_110;
              pfVar157[0x13] =
                   fStack_cc * fStack_4c + fStack_1ac + fVar100 * fVar136 + fVar107 * fVar128 +
                   auVar146._12_4_ * fVar32 + fStack_12c * fVar47 + fStack_ec * fVar60 +
                   fVar26 * fStack_6c + fVar121 * fStack_14c + auVar18._12_4_ * fStack_10c;
              pfVar157[0x14] =
                   fStack_c8 * fStack_48 + fStack_1a8 + fVar101 * fVar137 + fVar108 * fVar129 +
                   auVar146._16_4_ * fVar33 + fStack_128 * fVar48 + fStack_e8 * fVar61 +
                   fVar27 * fStack_68 + fVar122 * fStack_148 + auVar18._16_4_ * fStack_108;
              pfVar157[0x15] =
                   fStack_c4 * fStack_44 + fStack_1a4 + fVar102 * fVar138 + fVar109 * fVar130 +
                   auVar146._20_4_ * fVar42 + fStack_124 * fVar49 + fStack_e4 * fVar62 +
                   fVar28 * fStack_64 + fVar123 * fStack_144 + auVar18._20_4_ * fStack_104;
              pfVar157[0x16] =
                   fStack_c0 * fStack_40 + fStack_1a0 + fVar103 * fVar139 + fVar110 * fVar131 +
                   auVar146._24_4_ * fVar43 + fStack_120 * fVar50 + fStack_e0 * fVar63 +
                   fVar29 * fStack_60 + fVar124 * fStack_140 + auVar18._24_4_ * fStack_100;
              pfVar157[0x17] = fVar164 + fStack_19c + fStack_bc + fVar111 + fVar167 + fVar170;
              fVar165 = in_register_0000129c + in_register_0000125c;
              pfVar157[0x18] =
                   auVar18._0_4_ * local_d8 + local_1b8 + fVar163 * fVar133 + fVar23 * fVar125 +
                   local_f8 * fVar77 + auVar146._0_4_ * fVar34 + local_138 * fVar41 +
                   local_158 * fVar70 + local_118 * fVar54 + local_78 * fVar84;
              pfVar157[0x19] =
                   auVar18._4_4_ * fStack_d4 + fStack_1b4 + fVar173 * fVar134 + fVar24 * fVar126 +
                   fStack_f4 * fVar78 + auVar146._4_4_ * fVar35 + fStack_134 * fVar64 +
                   fStack_154 * fVar71 + fStack_114 * fVar55 + fStack_74 * fVar85;
              pfVar157[0x1a] =
                   auVar18._8_4_ * fStack_d0 + fStack_1b0 + fVar120 * fVar135 + fVar25 * fVar127 +
                   fStack_f0 * fVar79 + auVar146._8_4_ * fVar36 + fStack_130 * fVar65 +
                   fStack_150 * fVar72 + fStack_110 * fVar56 + fStack_70 * fVar86;
              pfVar157[0x1b] =
                   auVar18._12_4_ * fStack_cc + fStack_1ac + fVar121 * fVar136 + fVar26 * fVar128 +
                   fStack_ec * fVar80 + auVar146._12_4_ * fVar37 + fStack_12c * fVar66 +
                   fStack_14c * fVar73 + fStack_10c * fVar57 + fStack_6c * fVar87;
              pfVar157[0x1c] =
                   auVar18._16_4_ * fStack_c8 + fStack_1a8 + fVar122 * fVar137 + fVar27 * fVar129 +
                   fStack_e8 * fVar81 + auVar146._16_4_ * fVar38 + fStack_128 * fVar67 +
                   fStack_148 * fVar74 + fStack_108 * fVar58 + fStack_68 * fVar88;
              pfVar157[0x1d] =
                   auVar18._20_4_ * fStack_c4 + fStack_1a4 + fVar123 * fVar138 + fVar28 * fVar130 +
                   fStack_e4 * fVar82 + auVar146._20_4_ * fVar39 + fStack_124 * fVar68 +
                   fStack_144 * fVar75 + fStack_104 * fVar168 + fStack_64 * fVar89;
              pfVar157[0x1e] =
                   auVar18._24_4_ * fStack_c0 + fStack_1a0 + fVar124 * fVar139 + fVar29 * fVar131 +
                   fStack_e0 * fVar83 + auVar146._24_4_ * fVar40 + fStack_120 * fVar69 +
                   fStack_140 * fVar76 + fStack_100 * fVar59 + fStack_60 * fVar90;
              pfVar157[0x1f] = fVar165;
              pfVar158 = pfVar158 + 0x40;
              pfVar149 = pfVar149 + 0x40;
              pfVar152 = pfVar152 + 0x40;
              pfVar157 = pfVar157 + 0x20;
              iVar150 = iVar150 + 4;
              uVar151 = uVar21 & 0xfffffffc;
            } while (iVar150 < (int)uVar21);
          }
          uVar154 = uVar151 | 1;
          while ((int)uVar154 < (int)uVar21) {
            auVar18 = *(undefined1 (*) [32])(pfVar158 + 0x10);
            auVar19 = *(undefined1 (*) [32])(pfVar149 + 0x10);
            fVar97 = pfVar152[0x10];
            fVar98 = pfVar152[0x11];
            fVar99 = pfVar152[0x12];
            fVar100 = pfVar152[0x13];
            fVar101 = pfVar152[0x14];
            fVar102 = pfVar152[0x15];
            fVar103 = pfVar152[0x16];
            in_register_0000151c = pfVar152[0x17];
            fVar23 = pfVar158[1];
            fVar24 = pfVar158[2];
            fVar25 = pfVar158[3];
            fVar26 = pfVar158[4];
            fVar27 = pfVar158[5];
            fVar28 = pfVar158[6];
            fVar29 = pfVar158[9];
            fVar30 = pfVar158[10];
            fVar31 = pfVar158[0xb];
            fVar32 = pfVar158[0xc];
            fVar33 = pfVar158[0xd];
            fVar34 = pfVar158[0xe];
            fVar35 = pfVar149[1];
            fVar36 = pfVar149[2];
            fVar37 = pfVar149[3];
            fVar38 = pfVar149[4];
            fVar39 = pfVar149[5];
            fVar40 = pfVar149[6];
            fVar41 = pfVar149[9];
            fVar42 = pfVar149[10];
            fVar43 = pfVar149[0xb];
            fVar44 = pfVar149[0xc];
            fVar45 = pfVar149[0xd];
            fVar46 = pfVar149[0xe];
            fVar168 = in_register_0000125c + in_register_0000129c + in_register_0000129c +
                      in_register_0000129c;
            fVar47 = pfVar152[1];
            fVar48 = pfVar152[2];
            fVar49 = pfVar152[3];
            fVar50 = pfVar152[4];
            fVar51 = pfVar152[5];
            fVar52 = pfVar152[6];
            fVar53 = pfVar152[9];
            fVar54 = pfVar152[10];
            fVar55 = pfVar152[0xb];
            fVar56 = pfVar152[0xc];
            fVar57 = pfVar152[0xd];
            fVar58 = pfVar152[0xe];
            fStack_5c = auVar17._28_4_;
            fVar169 = fVar168 + in_register_0000129c + in_register_0000129c;
            fVar165 = fVar165 + fStack_19c + in_register_0000125c + in_register_0000129c + fVar168 +
                      fVar169;
            fVar168 = pfVar158[0x18];
            fVar59 = pfVar158[0x19];
            fVar60 = pfVar158[0x1a];
            fVar61 = pfVar158[0x1b];
            fVar62 = pfVar158[0x1c];
            fVar63 = pfVar158[0x1d];
            fVar64 = pfVar158[0x1e];
            fVar65 = pfVar158[0x20];
            fVar66 = pfVar158[0x21];
            fVar67 = pfVar158[0x22];
            fVar68 = pfVar158[0x23];
            fVar69 = pfVar158[0x24];
            fVar70 = pfVar158[0x25];
            fVar71 = pfVar158[0x26];
            fVar72 = pfVar149[0x18];
            fVar73 = pfVar149[0x19];
            fVar74 = pfVar149[0x1a];
            fVar75 = pfVar149[0x1b];
            fVar76 = pfVar149[0x1c];
            fVar77 = pfVar149[0x1d];
            fVar78 = pfVar149[0x1e];
            fVar79 = pfVar149[0x20];
            fVar80 = pfVar149[0x21];
            fVar81 = pfVar149[0x22];
            fVar82 = pfVar149[0x23];
            fVar83 = pfVar149[0x24];
            fVar84 = pfVar149[0x25];
            fVar85 = pfVar149[0x26];
            fVar86 = pfVar152[0x18];
            fVar87 = pfVar152[0x19];
            fVar88 = pfVar152[0x1a];
            fVar89 = pfVar152[0x1b];
            fVar90 = pfVar152[0x1c];
            fVar167 = pfVar152[0x1d];
            fVar170 = pfVar152[0x1e];
            fVar172 = pfVar152[0x20];
            fVar91 = pfVar152[0x21];
            fVar92 = pfVar152[0x22];
            fVar93 = pfVar152[0x23];
            fVar94 = pfVar152[0x24];
            fVar95 = pfVar152[0x25];
            fVar96 = pfVar152[0x26];
            in_register_0000125c = fVar169 + fVar119 + fVar119;
            in_register_0000129c = in_register_0000129c + fVar119 + fStack_5c;
            *pfVar157 = auVar143._0_4_ * *pfVar158 + local_1b8 +
                        fVar112 * pfVar158[8] + auVar18._0_4_ * auVar141._0_4_ +
                        fVar133 * *pfVar149 + auVar142._0_4_ * pfVar149[8] +
                        auVar19._0_4_ * local_158 +
                        fVar125 * *pfVar152 + local_f8 * pfVar152[8] + fVar97 * local_78;
            pfVar157[1] = auVar143._4_4_ * fVar23 + fStack_1b4 +
                          fVar113 * fVar29 + auVar18._4_4_ * auVar141._4_4_ +
                          fVar134 * fVar35 + auVar142._4_4_ * fVar41 + auVar19._4_4_ * fStack_154 +
                          fVar126 * fVar47 + fStack_f4 * fVar53 + fVar98 * fStack_74;
            pfVar157[2] = auVar143._8_4_ * fVar24 + fStack_1b0 +
                          fVar114 * fVar30 + auVar18._8_4_ * auVar141._8_4_ +
                          fVar135 * fVar36 + auVar142._8_4_ * fVar42 + auVar19._8_4_ * fStack_150 +
                          fVar127 * fVar48 + fStack_f0 * fVar54 + fVar99 * fStack_70;
            pfVar157[3] = fStack_cc * fVar25 + fStack_1ac +
                          fVar115 * fVar31 + auVar18._12_4_ * fStack_10c +
                          fVar136 * fVar37 + fStack_12c * fVar43 + auVar19._12_4_ * fStack_14c +
                          fVar128 * fVar49 + fStack_ec * fVar55 + fVar100 * fStack_6c;
            pfVar157[4] = fStack_c8 * fVar26 + fStack_1a8 +
                          fVar116 * fVar32 + auVar18._16_4_ * fStack_108 +
                          fVar137 * fVar38 + fStack_128 * fVar44 + auVar19._16_4_ * fStack_148 +
                          fVar129 * fVar50 + fStack_e8 * fVar56 + fVar101 * fStack_68;
            pfVar157[5] = fStack_c4 * fVar27 + fStack_1a4 +
                          fVar117 * fVar33 + auVar18._20_4_ * fStack_104 +
                          fVar138 * fVar39 + fStack_124 * fVar45 + auVar19._20_4_ * fStack_144 +
                          fVar130 * fVar51 + fStack_e4 * fVar57 + fVar102 * fStack_64;
            pfVar157[6] = fStack_c0 * fVar28 + fStack_1a0 +
                          fVar118 * fVar34 + auVar18._24_4_ * fStack_100 +
                          fVar139 * fVar40 + fStack_120 * fVar46 + auVar19._24_4_ * fStack_140 +
                          fVar131 * fVar52 + fStack_e0 * fVar58 + fVar103 * fStack_60;
            pfVar157[7] = fVar165;
            in_register_000012dc = fVar119 + fStack_19c;
            fVar165 = in_register_000012dc + fVar165 + fVar119 + in_register_0000125c +
                      in_register_0000129c;
            pfVar157[8] = auVar18._0_4_ * auVar143._0_4_ + local_1b8 +
                          auVar19._0_4_ * fVar133 + fVar97 * fVar125 +
                          fVar112 * fVar168 + auVar142._0_4_ * fVar72 + local_f8 * fVar86 +
                          auVar141._0_4_ * fVar65 + local_158 * fVar79 + local_78 * fVar172;
            pfVar157[9] = auVar18._4_4_ * auVar143._4_4_ + fStack_1b4 +
                          auVar19._4_4_ * fVar134 + fVar98 * fVar126 +
                          fVar113 * fVar59 + auVar142._4_4_ * fVar73 + fStack_f4 * fVar87 +
                          auVar141._4_4_ * fVar66 + fStack_154 * fVar80 + fStack_74 * fVar91;
            pfVar157[10] = auVar18._8_4_ * auVar143._8_4_ + fStack_1b0 +
                           auVar19._8_4_ * fVar135 + fVar99 * fVar127 +
                           fVar114 * fVar60 + auVar142._8_4_ * fVar74 + fStack_f0 * fVar88 +
                           auVar141._8_4_ * fVar67 + fStack_150 * fVar81 + fStack_70 * fVar92;
            pfVar157[0xb] =
                 auVar18._12_4_ * fStack_cc + fStack_1ac +
                 auVar19._12_4_ * fVar136 + fVar100 * fVar128 +
                 fVar115 * fVar61 + fStack_12c * fVar75 + fStack_ec * fVar89 +
                 fStack_10c * fVar68 + fStack_14c * fVar82 + fStack_6c * fVar93;
            pfVar157[0xc] =
                 auVar18._16_4_ * fStack_c8 + fStack_1a8 +
                 auVar19._16_4_ * fVar137 + fVar101 * fVar129 +
                 fVar116 * fVar62 + fStack_128 * fVar76 + fStack_e8 * fVar90 +
                 fStack_108 * fVar69 + fStack_148 * fVar83 + fStack_68 * fVar94;
            pfVar157[0xd] =
                 auVar18._20_4_ * fStack_c4 + fStack_1a4 +
                 auVar19._20_4_ * fVar138 + fVar102 * fVar130 +
                 fVar117 * fVar63 + fStack_124 * fVar77 + fStack_e4 * fVar167 +
                 fStack_104 * fVar70 + fStack_144 * fVar84 + fStack_64 * fVar95;
            pfVar157[0xe] =
                 auVar18._24_4_ * fStack_c0 + fStack_1a0 +
                 auVar19._24_4_ * fVar139 + fVar103 * fVar131 +
                 fVar118 * fVar64 + fStack_120 * fVar78 + fStack_e0 * fVar170 +
                 fStack_100 * fVar71 + fStack_140 * fVar85 + fStack_60 * fVar96;
            pfVar157[0xf] = fVar165;
            pfVar158 = pfVar158 + 0x20;
            pfVar149 = pfVar149 + 0x20;
            pfVar152 = pfVar152 + 0x20;
            pfVar157 = pfVar157 + 0x10;
            uVar154 = uVar151 + 3;
            uVar151 = uVar151 + 2;
          }
          iVar150 = uVar21 - uVar151;
          if (iVar150 != 0 && (int)uVar151 <= (int)uVar21) {
            lVar148 = 0;
            lVar155 = 0;
            do {
              pfVar13 = (float *)((long)pfVar158 + lVar155 * 2);
              fVar23 = pfVar13[1];
              fVar24 = pfVar13[2];
              fVar25 = pfVar13[3];
              fVar26 = pfVar13[4];
              fVar27 = pfVar13[5];
              fVar28 = pfVar13[6];
              pfVar7 = (float *)((long)pfVar158 + lVar155 * 2 + 0x20);
              fVar29 = pfVar7[1];
              fVar30 = pfVar7[2];
              fVar31 = pfVar7[3];
              fVar32 = pfVar7[4];
              fVar33 = pfVar7[5];
              fVar34 = pfVar7[6];
              pfVar8 = (float *)((long)pfVar158 + lVar155 * 2 + 0x40);
              fVar35 = pfVar8[1];
              fVar36 = pfVar8[2];
              fVar37 = pfVar8[3];
              fVar38 = pfVar8[4];
              fVar39 = pfVar8[5];
              fVar40 = pfVar8[6];
              pfVar3 = (float *)((long)pfVar149 + lVar155 * 2);
              fVar41 = pfVar3[1];
              fVar42 = pfVar3[2];
              fVar43 = pfVar3[3];
              fVar44 = pfVar3[4];
              fVar45 = pfVar3[5];
              fVar46 = pfVar3[6];
              pfVar9 = (float *)((long)pfVar149 + lVar155 * 2 + 0x20);
              fVar47 = pfVar9[1];
              fVar48 = pfVar9[2];
              fVar49 = pfVar9[3];
              fVar50 = pfVar9[4];
              fVar51 = pfVar9[5];
              fVar52 = pfVar9[6];
              pfVar10 = (float *)((long)pfVar149 + lVar155 * 2 + 0x40);
              fVar53 = pfVar10[1];
              fVar54 = pfVar10[2];
              fVar55 = pfVar10[3];
              fVar56 = pfVar10[4];
              fVar57 = pfVar10[5];
              fVar58 = pfVar10[6];
              fVar165 = fVar119 + in_register_0000129c + in_register_0000129c + in_register_000012dc
              ;
              pfVar4 = (float *)((long)pfVar152 + lVar155 * 2);
              fVar168 = pfVar4[1];
              fVar59 = pfVar4[2];
              fVar60 = pfVar4[3];
              fVar61 = pfVar4[4];
              fVar62 = pfVar4[5];
              fVar63 = pfVar4[6];
              pfVar11 = (float *)((long)pfVar152 + lVar155 * 2 + 0x20);
              fVar64 = pfVar11[1];
              fVar65 = pfVar11[2];
              fVar66 = pfVar11[3];
              fVar67 = pfVar11[4];
              fVar68 = pfVar11[5];
              fVar69 = pfVar11[6];
              pfVar12 = (float *)((long)pfVar152 + lVar155 * 2 + 0x40);
              fVar70 = pfVar12[1];
              fVar71 = pfVar12[2];
              fVar72 = pfVar12[3];
              fVar73 = pfVar12[4];
              fVar74 = pfVar12[5];
              fVar75 = pfVar12[6];
              in_register_0000125c = in_register_0000129c + fVar165 + in_register_0000129c;
              fVar165 = fStack_bc + fStack_19c + fVar119 + in_register_0000129c + fVar165 +
                        in_register_0000125c;
              pfVar5 = (float *)((long)pfVar157 + lVar155);
              *pfVar5 = local_d8 * *pfVar13 + local_1b8 +
                        fVar112 * *pfVar7 + auVar144._0_4_ * *pfVar8 +
                        fVar133 * *pfVar3 + auVar145._0_4_ * *pfVar9 + local_158 * *pfVar10 +
                        fVar125 * *pfVar4 + local_f8 * *pfVar11 + local_78 * *pfVar12;
              pfVar5[1] = fStack_d4 * fVar23 + fStack_1b4 +
                          fVar113 * fVar29 + auVar144._4_4_ * fVar35 +
                          fVar134 * fVar41 + auVar145._4_4_ * fVar47 + fStack_154 * fVar53 +
                          fVar126 * fVar168 + fStack_f4 * fVar64 + fStack_74 * fVar70;
              pfVar5[2] = fStack_d0 * fVar24 + fStack_1b0 +
                          fVar114 * fVar30 + auVar144._8_4_ * fVar36 +
                          fVar135 * fVar42 + auVar145._8_4_ * fVar48 + fStack_150 * fVar54 +
                          fVar127 * fVar59 + fStack_f0 * fVar65 + fStack_70 * fVar71;
              pfVar5[3] = fStack_cc * fVar25 + fStack_1ac + fVar115 * fVar31 + fStack_10c * fVar37 +
                          fVar136 * fVar43 + fStack_12c * fVar49 + fStack_14c * fVar55 +
                          fVar128 * fVar60 + fStack_ec * fVar66 + fStack_6c * fVar72;
              pfVar5[4] = fStack_c8 * fVar26 + fStack_1a8 + fVar116 * fVar32 + fStack_108 * fVar38 +
                          fVar137 * fVar44 + fStack_128 * fVar50 + fStack_148 * fVar56 +
                          fVar129 * fVar61 + fStack_e8 * fVar67 + fStack_68 * fVar73;
              pfVar5[5] = fStack_c4 * fVar27 + fStack_1a4 + fVar117 * fVar33 + fStack_104 * fVar39 +
                          fVar138 * fVar45 + fStack_124 * fVar51 + fStack_144 * fVar57 +
                          fVar130 * fVar62 + fStack_e4 * fVar68 + fStack_64 * fVar74;
              pfVar5[6] = fStack_c0 * fVar28 + fStack_1a0 + fVar118 * fVar34 + fStack_100 * fVar40 +
                          fVar139 * fVar46 + fStack_120 * fVar52 + fStack_140 * fVar58 +
                          fVar131 * fVar63 + fStack_e0 * fVar69 + fStack_60 * fVar75;
              pfVar5[7] = fVar165;
              lVar155 = lVar155 + 0x20;
              lVar148 = lVar148 + -0x40;
              iVar150 = iVar150 + -1;
            } while (iVar150 != 0);
            pfVar157 = (float *)((long)pfVar157 + lVar155);
            pfVar158 = (float *)((long)pfVar158 - lVar148);
            pfVar149 = (float *)((long)pfVar149 - lVar148);
            pfVar152 = (float *)((long)pfVar152 - lVar148);
          }
          pfVar158 = pfVar158 + iVar147;
          pfVar149 = pfVar149 + iVar147;
          pfVar152 = pfVar152 + iVar147;
          iVar153 = iVar153 + 1;
        } while (iVar153 != iVar22);
      }
      lVar156 = lVar156 + 1;
    } while (lVar156 != iVar20);
  }
  return;
}

Assistant:

static void convdw3x3s2_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 8;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = _mm256_loadu_ps(k0);
        __m256 _k01 = _mm256_loadu_ps(k0 + 8);
        __m256 _k02 = _mm256_loadu_ps(k0 + 16);
        __m256 _k10 = _mm256_loadu_ps(k0 + 24);
        __m256 _k11 = _mm256_loadu_ps(k0 + 32);
        __m256 _k12 = _mm256_loadu_ps(k0 + 40);
        __m256 _k20 = _mm256_loadu_ps(k0 + 48);
        __m256 _k21 = _mm256_loadu_ps(k0 + 56);
        __m256 _k22 = _mm256_loadu_ps(k0 + 64);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r05, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r06, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r15, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r16, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r24, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r25, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r26, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r06, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r07, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r08, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r16, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r17, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r18, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r26, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r27, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r28, _sum3);

                _mm256_storeu_ps(outptr0 + 24, _sum3);

                r0 += 2 * 32;
                r1 += 2 * 32;
                r2 += 2 * 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);

                _mm256_storeu_ps(outptr0 + 8, _sum1);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _mm256_storeu_ps(outptr0, _sum0);
                r0 += 2 * 8;
                r1 += 2 * 8;
                r2 += 2 * 8;
                outptr0 += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}